

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsTTDNotifyLongLivedReferenceAdd(JsValueRef value)

{
  JsErrorCode JVar1;
  JsValueRef local_10;
  JsValueRef value_local;
  
  local_10 = value;
  JVar1 = GlobalAPIWrapper<JsTTDNotifyLongLivedReferenceAdd::__0>
                    ((anon_class_8_1_a8c68091)&local_10);
  return JVar1;
}

Assistant:

CHAKRA_API JsTTDNotifyLongLivedReferenceAdd(_In_ JsValueRef value)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper([&](TTDRecorder& _actionEntryPopper) -> JsErrorCode
    {
        ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();
        if(threadContext == nullptr)
        {
            return JsErrorNoCurrentContext;
        }

        if (Js::VarIs<Js::RecyclableObject>(value))
        {
            Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(value);
            if (obj->GetScriptContext()->IsTTDRecordModeEnabled())
            {
                if (obj->GetScriptContext()->ShouldPerformRecordAction())
                {
                    threadContext->TTDLog->RecordJsRTAddWeakRootRef(_actionEntryPopper, (Js::Var)value);
                }

                threadContext->TTDContext->AddRootRef_Record(TTD_CONVERT_OBJ_TO_LOG_PTR_ID(obj), obj);
            }
        }

        return JsNoError;
    });
#endif
}